

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

void __thiscall HandleTpl::HandleTpl(HandleTpl *this,VarnodeTpl *vn)

{
  undefined4 uVar1;
  ConstTpl *pCVar2;
  ConstTpl local_38;
  VarnodeTpl *local_18;
  VarnodeTpl *vn_local;
  HandleTpl *this_local;
  
  local_18 = vn;
  vn_local = (VarnodeTpl *)this;
  ConstTpl::ConstTpl(&this->space);
  ConstTpl::ConstTpl(&this->size);
  ConstTpl::ConstTpl(&this->ptrspace);
  ConstTpl::ConstTpl(&this->ptroffset);
  ConstTpl::ConstTpl(&this->ptrsize);
  ConstTpl::ConstTpl(&this->temp_space);
  ConstTpl::ConstTpl(&this->temp_offset);
  pCVar2 = VarnodeTpl::getSpace(local_18);
  uVar1 = *(undefined4 *)&pCVar2->field_0x4;
  (this->space).type = pCVar2->type;
  *(undefined4 *)&(this->space).field_0x4 = uVar1;
  (this->space).value = pCVar2->value;
  (this->space).value_real = pCVar2->value_real;
  (this->space).select = pCVar2->select;
  pCVar2 = VarnodeTpl::getSize(local_18);
  uVar1 = *(undefined4 *)&pCVar2->field_0x4;
  (this->size).type = pCVar2->type;
  *(undefined4 *)&(this->size).field_0x4 = uVar1;
  (this->size).value = pCVar2->value;
  (this->size).value_real = pCVar2->value_real;
  (this->size).select = pCVar2->select;
  ConstTpl::ConstTpl(&local_38,real,0);
  (this->ptrspace).type = local_38.type;
  *(undefined4 *)&(this->ptrspace).field_0x4 = local_38._4_4_;
  (this->ptrspace).value = local_38.value;
  (this->ptrspace).value_real = local_38.value_real;
  (this->ptrspace).select = local_38.select;
  pCVar2 = VarnodeTpl::getOffset(local_18);
  uVar1 = *(undefined4 *)&pCVar2->field_0x4;
  (this->ptroffset).type = pCVar2->type;
  *(undefined4 *)&(this->ptroffset).field_0x4 = uVar1;
  (this->ptroffset).value = pCVar2->value;
  (this->ptroffset).value_real = pCVar2->value_real;
  (this->ptroffset).select = pCVar2->select;
  return;
}

Assistant:

HandleTpl::HandleTpl(const VarnodeTpl *vn)

{				// Build handle which indicates given varnode
  space = vn->getSpace();
  size = vn->getSize();
  ptrspace = ConstTpl(ConstTpl::real,0);
  ptroffset = vn->getOffset();
}